

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManFromIfLogicCofVars
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Cut_t *pCutBest,Vec_Int_t *vLeaves,
              Vec_Int_t *vLeaves2,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2)

{
  byte bVar1;
  Vec_Mem_t *pVVar2;
  word wVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  ulong *puVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  word *pwVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int Fill;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  ulong uVar18;
  word *pwVar19;
  word *pLimit;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint iVar;
  Vec_Int_t *p;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iLitCofs [3];
  int pVarsNew [16];
  word pTruthCof [128];
  uint local_4f4 [3];
  Vec_Int_t *local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  long local_4d0;
  uint *local_4c8;
  word *local_4c0;
  ulong local_4b8;
  ulong *local_4b0;
  ulong *local_4a8;
  long local_4a0;
  ulong local_498;
  word *local_490;
  undefined1 local_488 [16];
  int aiStack_478 [16];
  word local_438 [129];
  
  uVar24 = pCutBest->iCutFunc;
  if ((int)uVar24 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/if.h"
                  ,0x1ab,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  local_4a8 = pIfMan->puTempW;
  pVVar2 = pIfMan->vTtMem[(byte)pCutBest->field_0x1f];
  if (pVVar2 == (Vec_Mem_t *)0x0) {
    pwVar14 = (word *)0x0;
  }
  else {
    uVar15 = uVar24 >> 1;
    if (pVVar2->nEntries <= (int)uVar15) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar14 = pVVar2->ppPages[uVar15 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
              (ulong)(uVar15 & pVVar2->PageMask) * (long)pVVar2->nEntrySize;
  }
  uVar15 = pIfMan->nTruth6Words[(byte)pCutBest->field_0x1f];
  if ((uVar24 & 1) == 0) {
    if (0 < (int)uVar15) {
      uVar23 = 0;
      do {
        local_4a8[uVar23] = pwVar14[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar15 != uVar23);
    }
  }
  else if (0 < (int)uVar15) {
    uVar23 = 0;
    do {
      local_4a8[uVar23] = ~pwVar14[uVar23];
      uVar23 = uVar23 + 1;
    } while (uVar15 != uVar23);
  }
  uVar15 = *(uint *)&pCutBest->field_0x1c;
  uVar16 = uVar15 >> 0x18;
  uVar22 = 1 << ((char)(uVar15 >> 0x18) - 6U & 0x1f);
  if (uVar15 < 0x7000000) {
    uVar22 = 1;
  }
  if (pIfMan->vTtVars[uVar16]->nSize <= (int)(uVar24 >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  bVar1 = pIfMan->vTtVars[uVar16]->pArray[uVar24 >> 1];
  uVar24 = (uint)(char)bVar1;
  if ((((int)uVar24 < 0) || ((int)uVar16 <= (int)uVar24)) || (0xd < pIfMan->pPars->nLutSize)) {
    __assert_fail("iVar >= 0 && iVar < nLeaves && pIfMan->pPars->nLutSize <= 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x650,
                  "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  local_4b0 = local_4a8 + (int)uVar22;
  iVar12 = uVar24 - 6;
  uVar20 = 1 << ((byte)iVar12 & 0x1f);
  uVar23 = 1;
  if (1 < (int)uVar20) {
    uVar23 = (ulong)uVar20;
  }
  local_4d8 = (ulong)(uint)(1 << (bVar1 & 0x1f));
  local_4e0 = (ulong)uVar22;
  local_4b8 = (ulong)(uVar16 + 1 & 0xfffffffe);
  lVar25 = (ulong)uVar16 - 1;
  local_488._8_4_ = (int)lVar25;
  local_488._0_8_ = lVar25;
  local_488._12_4_ = (int)((ulong)lVar25 >> 0x20);
  local_4d0 = (long)(2 << ((byte)iVar12 & 0x1f)) << 3;
  local_4c0 = local_438 + (int)uVar20;
  local_4a0 = (long)(int)uVar20 << 3;
  puVar8 = local_4f4;
  local_488 = local_488 ^ _DAT_008403e0;
  local_4e8 = vLeaves2;
  bVar5 = true;
  do {
    bVar4 = bVar5;
    if (0xffffff < uVar15) {
      uVar9 = 0;
      auVar26 = _DAT_008403d0;
      do {
        auVar27 = auVar26 ^ _DAT_008403e0;
        if ((bool)(~(local_488._4_4_ < auVar27._4_4_ ||
                    local_488._0_4_ < auVar27._0_4_ && auVar27._4_4_ == local_488._4_4_) & 1)) {
          aiStack_478[uVar9] = (int)uVar9;
        }
        if (auVar27._12_4_ <= local_488._12_4_ &&
            (auVar27._8_4_ <= local_488._8_4_ || auVar27._12_4_ != local_488._12_4_)) {
          aiStack_478[uVar9 + 1] = (int)uVar9 + 1;
        }
        uVar9 = uVar9 + 2;
        lVar25 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 2;
        auVar26._8_8_ = lVar25 + 2;
      } while (local_4b8 != uVar9);
    }
    bVar11 = (byte)local_4d8;
    if (bVar4) {
      if (uVar22 == 1) {
        uVar9 = s_Truths6Neg[(int)uVar24] & *local_4a8;
        uVar18 = uVar9 << (bVar11 & 0x3f);
LAB_006f504a:
        local_438[0] = uVar18 | uVar9;
      }
      else if (bVar1 < 6) {
        if (0 < (int)uVar22) {
          uVar9 = s_Truths6Neg[(int)uVar24];
          uVar18 = 0;
          do {
            local_438[uVar18] =
                 (local_4a8[uVar18] & uVar9) << (bVar11 & 0x3f) | local_4a8[uVar18] & uVar9;
            uVar18 = uVar18 + 1;
          } while (local_4e0 != uVar18);
        }
      }
      else if (0 < (int)uVar22) {
        pwVar14 = local_438;
        puVar10 = local_4a8;
        pwVar19 = local_4c0;
        do {
          if (iVar12 != 0x1f) {
            uVar9 = 0;
            do {
              uVar18 = puVar10[uVar9];
              pwVar14[uVar9] = uVar18;
              pwVar19[uVar9] = uVar18;
              uVar9 = uVar9 + 1;
            } while (uVar23 != uVar9);
          }
          puVar10 = (ulong *)((long)puVar10 + local_4d0);
          pwVar19 = (word *)((long)pwVar19 + local_4d0);
          pwVar14 = (word *)((long)pwVar14 + local_4d0);
        } while (puVar10 < local_4b0);
      }
    }
    else {
      if (uVar22 == 1) {
        uVar9 = Gia_ManFromIfLogicNode::Truth6[(int)uVar24] & *local_4a8;
        uVar18 = uVar9 >> (bVar11 & 0x3f);
        goto LAB_006f504a;
      }
      if (bVar1 < 6) {
        if (0 < (int)uVar22) {
          uVar9 = Gia_ManFromIfLogicNode::Truth6[(int)uVar24];
          uVar18 = 0;
          do {
            local_438[uVar18] =
                 (local_4a8[uVar18] & uVar9) >> (bVar11 & 0x3f) | local_4a8[uVar18] & uVar9;
            uVar18 = uVar18 + 1;
          } while (local_4e0 != uVar18);
        }
      }
      else if (0 < (int)uVar22) {
        pwVar14 = local_438;
        puVar10 = local_4a8;
        do {
          if (iVar12 != 0x1f) {
            uVar9 = 0;
            do {
              wVar3 = *(word *)((long)puVar10 + uVar9 * 8 + local_4a0);
              pwVar14[uVar9] = wVar3;
              *(word *)((long)pwVar14 + uVar9 * 8 + local_4a0) = wVar3;
              uVar9 = uVar9 + 1;
            } while (uVar23 != uVar9);
          }
          puVar10 = (ulong *)((long)puVar10 + local_4d0);
          pwVar14 = (word *)((long)pwVar14 + local_4d0);
        } while (puVar10 < local_4b0);
      }
    }
    uVar16 = *(uint *)&pCutBest->field_0x1c;
    uVar20 = uVar16 >> 0x18;
    uVar9 = 6;
    if (6 < uVar20) {
      uVar9 = (ulong)uVar20;
    }
    local_4c8 = puVar8;
    if (uVar16 < 0x1000000) {
      local_4e8->nSize = 0;
      iVar = 0;
LAB_006f5350:
      p = local_4e8;
      uVar16 = Kit_TruthToGia(pNew,(uint *)local_438,iVar,vCover,local_4e8,0);
      *local_4c8 = uVar16;
    }
    else {
      iVar13 = (int)uVar9 + -6;
      uVar6 = 1 << ((byte)iVar13 & 0x1f);
      local_490 = local_438 + (int)uVar6;
      if ((int)uVar6 < 2) {
        uVar6 = 1;
      }
      uVar18 = 0;
      iVar = 0;
      local_498 = uVar9;
      do {
        if (uVar16 < 0x7000000) {
          if ((s_Truths6Neg[uVar18] &
              (local_438[0] >> ((byte)(1 << ((byte)uVar18 & 0x1f)) & 0x3f) ^ local_438[0])) != 0) {
LAB_006f50fc:
            if ((long)(int)iVar < (long)uVar18) {
              aiStack_478[(int)iVar] = aiStack_478[uVar18];
              Abc_TtSwapVars(local_438,(int)local_498,iVar,(int)uVar18);
            }
            iVar = iVar + 1;
          }
        }
        else if (uVar18 < 6) {
          if (iVar13 != 0x1f) {
            uVar9 = 0;
            do {
              if (((local_438[uVar9] >> ((byte)(1 << ((byte)uVar18 & 0x1f)) & 0x3f) ^
                   local_438[uVar9]) & s_Truths6Neg[uVar18]) != 0) goto LAB_006f50fc;
              uVar9 = uVar9 + 1;
            } while (uVar6 != uVar9);
          }
        }
        else if (iVar13 != 0x1f) {
          bVar11 = (byte)(uVar18 - 6);
          uVar7 = 1 << (bVar11 & 0x1f);
          iVar17 = 2 << (bVar11 & 0x1f);
          uVar9 = 1;
          if (1 < (int)uVar7) {
            uVar9 = (ulong)uVar7;
          }
          pwVar19 = local_438 + (int)uVar7;
          pwVar14 = local_438;
          do {
            if (uVar18 - 6 != 0x1f) {
              uVar21 = 0;
              do {
                if (pwVar14[uVar21] != pwVar19[uVar21]) goto LAB_006f50fc;
                uVar21 = uVar21 + 1;
              } while (uVar9 != uVar21);
            }
            pwVar14 = pwVar14 + iVar17;
            pwVar19 = pwVar19 + iVar17;
          } while (pwVar14 < local_490);
        }
        p = local_4e8;
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar20);
      if ((int)uVar20 < (int)iVar) {
        __assert_fail("k < nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x5c4,"int Abc_TtMinBase(word *, int *, int, int)");
      }
      local_4e8->nSize = 0;
      if ((int)iVar < 1) goto LAB_006f5350;
      uVar9 = 0;
      do {
        iVar13 = aiStack_478[uVar9];
        if (((long)iVar13 < 0) || (vLeaves->nSize <= iVar13)) goto LAB_006f5731;
        Vec_IntPush(p,vLeaves->pArray[iVar13]);
        uVar9 = uVar9 + 1;
      } while (iVar != uVar9);
      uVar16 = Kit_TruthToGia(pNew,(uint *)local_438,iVar,vCover,p,0);
      *local_4c8 = uVar16;
      if (iVar != 1) {
        if ((int)uVar16 < 0) goto LAB_006f5750;
        uVar16 = uVar16 >> 1;
        if (pNew->nObjs <= (int)uVar16) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar20 = (uint)*(undefined8 *)(pNew->pObjs + uVar16);
        if (((int)uVar20 < 0) || ((uVar20 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c])))",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                        ,0x662,
                        "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar13 = vMapping2->nSize;
        Vec_IntFillExtra(vMapping,uVar16 + 1,Fill);
        if (vMapping->nSize <= (int)uVar16) goto LAB_006f578e;
        vMapping->pArray[uVar16] = iVar13;
        Vec_IntPush(vMapping2,p->nSize);
        if (0 < p->nSize) {
          lVar25 = 0;
          do {
            if (p->pArray[lVar25] < 0) goto LAB_006f5750;
            Vec_IntPush(vMapping2,(uint)p->pArray[lVar25] >> 1);
            lVar25 = lVar25 + 1;
          } while (lVar25 < p->nSize);
        }
        Vec_IntPush(vMapping2,uVar16);
      }
    }
    puVar8 = local_4f4 + 1;
    bVar5 = false;
  } while (bVar4);
  if (vLeaves->nSize <= (int)uVar24) {
LAB_006f5731:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar24 = vLeaves->pArray[uVar24];
  local_4f4[2] = uVar24;
  if ((int)local_4f4[1] < 2 || (int)local_4f4[0] < 2) {
    if ((int)local_4f4[0] < 2 && (int)local_4f4[1] < 2) {
      __assert_fail("iLitCofs[0] > 1 || iLitCofs[1] > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x677,
                    "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    p->nSize = 0;
    lVar25 = 0;
    do {
      if (1 < (int)local_4f4[lVar25]) {
        Vec_IntPush(p,local_4f4[lVar25]);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != 3);
    if (p->nSize != 2) {
      __assert_fail("Vec_IntSize(vLeaves2) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x67d,
                    "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (local_4f4[0] != 1) {
      uVar15 = uVar24;
      if (local_4f4[0] != 0) {
        if (local_4f4[1] == 1) {
          if (((int)uVar24 < 0) || ((int)local_4f4[0] < 0)) goto LAB_006f5848;
          uVar15 = uVar24 ^ 1;
          goto LAB_006f567b;
        }
        if (local_4f4[1] != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                        ,0x687,
                        "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if ((int)uVar24 < 0) goto LAB_006f5848;
        uVar15 = uVar24 ^ 1;
        local_4f4[1] = local_4f4[0];
      }
      uVar15 = Gia_ManAppendAnd(pNew,uVar15,local_4f4[1]);
      iVar12 = extraout_EDX_00;
      goto LAB_006f5653;
    }
    if (((int)uVar24 < 0) || (uVar15 = uVar24, local_4f4[0] = local_4f4[1], (int)local_4f4[1] < 0))
    goto LAB_006f5848;
LAB_006f567b:
    uVar15 = Gia_ManAppendAnd(pNew,uVar15,local_4f4[0] ^ 1);
    if ((int)uVar15 < 0) {
LAB_006f5848:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf4,"int Abc_LitNot(int)");
    }
    uVar15 = uVar15 ^ 1;
    iVar12 = extraout_EDX_01;
  }
  else {
    local_438[0] = 0xcacacacacacacaca;
    p->nSize = 0;
    Vec_IntPush(p,local_4f4[0]);
    Vec_IntPush(p,local_4f4[1]);
    Vec_IntPush(p,uVar24);
    uVar24 = Kit_TruthToGia(pNew,(uint *)local_438,p->nSize,vCover,p,0);
    uVar15 = uVar24;
    iVar12 = extraout_EDX;
LAB_006f5653:
    if ((int)uVar15 < 0) goto LAB_006f5750;
  }
  uVar16 = uVar15 >> 1;
  iVar13 = vMapping2->nSize;
  Vec_IntFillExtra(vMapping,uVar16 + 1,iVar12);
  if (vMapping->nSize <= (int)uVar16) {
LAB_006f578e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  vMapping->pArray[uVar16] = iVar13;
  Vec_IntPush(vMapping2,p->nSize);
  if (0 < p->nSize) {
    lVar25 = 0;
    do {
      if (p->pArray[lVar25] < 0) goto LAB_006f5750;
      Vec_IntPush(vMapping2,(uint)p->pArray[lVar25] >> 1);
      lVar25 = lVar25 + 1;
    } while (lVar25 < p->nSize);
  }
  if (-1 < (int)uVar24) {
    Vec_IntPush(vMapping2,-(uVar24 >> 1));
    return *(uint *)&pCutBest->field_0x1c >> 0xc & 1 ^ uVar15;
  }
LAB_006f5750:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

int Gia_ManFromIfLogicCofVars( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Cut_t * pCutBest, Vec_Int_t * vLeaves, Vec_Int_t * vLeaves2, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    word pTruthCof[128], * pTruth = If_CutTruthW(pIfMan, pCutBest);
    int pVarsNew[16], nVarsNew, iLitCofs[3]; 
    int nLeaves = pCutBest->nLeaves;
    int nWords  = Abc_Truth6WordNum(nLeaves);
    int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
    int c, iVar = Vec_StrEntry(pIfMan->vTtVars[nLeaves], truthId), iTemp, iTopLit;
    int k, RetValue = -1;
    assert( iVar >= 0 && iVar < nLeaves && pIfMan->pPars->nLutSize <= 13 );
    for ( c = 0; c < 2; c++ )
    {
        for ( k = 0; k < nLeaves; k++ )
            pVarsNew[k] = k;
        if ( c )
            Abc_TtCofactor1p( pTruthCof, pTruth, nWords, iVar );
        else
            Abc_TtCofactor0p( pTruthCof, pTruth, nWords, iVar );
        nVarsNew = Abc_TtMinBase( pTruthCof, pVarsNew, pCutBest->nLeaves, Abc_MaxInt(6, pCutBest->nLeaves) );
        // derive LUT
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < nVarsNew; k++ )
            Vec_IntPush( vLeaves2, Vec_IntEntry(vLeaves, pVarsNew[k]) );
        iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, nVarsNew, vCover, vLeaves2, 0 );
        if ( nVarsNew < 2 )
            continue;
        // create mapping
        assert( Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c]))) );
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
        Vec_IntForEachEntry( vLeaves2, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
    }
    iLitCofs[2]  = Vec_IntEntry(vLeaves, iVar);
    // derive MUX
    if ( iLitCofs[0] > 1 && iLitCofs[1] > 1 )
    {
        pTruthCof[0] = ABC_CONST(0xCACACACACACACACA);
        Vec_IntClear( vLeaves2 );
        Vec_IntPush( vLeaves2, iLitCofs[0] );
        Vec_IntPush( vLeaves2, iLitCofs[1] );
        Vec_IntPush( vLeaves2, iLitCofs[2] );
        RetValue = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, Vec_IntSize(vLeaves2), vCover, vLeaves2, 0 );
        iTopLit = RetValue;
    }
    else
    {
        assert( iLitCofs[0] > 1 || iLitCofs[1] > 1 );
        // collect leaves
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < 3; k++ )
            if ( iLitCofs[k] > 1 )
                Vec_IntPush( vLeaves2, iLitCofs[k] );
        assert( Vec_IntSize(vLeaves2) == 2 );
        // consider three possibilities
        if ( iLitCofs[0] == 0 )
            RetValue = Gia_ManAppendAnd( pNew, iLitCofs[2], iLitCofs[1] );
        else if ( iLitCofs[0] == 1 )
            RetValue = Gia_ManAppendOr( pNew, Abc_LitNot(iLitCofs[2]), iLitCofs[1] );
        else if ( iLitCofs[1] == 0 )
            RetValue = Gia_ManAppendAnd( pNew, Abc_LitNot(iLitCofs[2]), iLitCofs[0] );
        else if ( iLitCofs[1] == 1 )
            RetValue = Gia_ManAppendOr( pNew, iLitCofs[2], iLitCofs[0] );
        else assert( 0 );
        iTopLit = iLitCofs[2];
    }
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(RetValue), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
    Vec_IntForEachEntry( vLeaves2, iTemp, k )
        Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
    Vec_IntPush( vMapping2, -Abc_Lit2Var(iTopLit) );
    RetValue = Abc_LitNotCond( RetValue, pCutBest->fCompl );
    return RetValue;
}